

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScroller::scrollTo(QScroller *this,QPointF *pos,int scrollTime)

{
  bool bVar1;
  QScrollerPrivate *deltaTime;
  ulong uVar2;
  QDebug *pQVar3;
  int in_EDX;
  QScrollerPrivate *in_RSI;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  QScroller *this_00;
  qreal ypos;
  QScrollerPrivate *this_01;
  QScrollerPrivate *this_02;
  qreal time;
  qreal snapY;
  qreal snapX;
  QScrollerPrivate *d;
  QPointF vel;
  QPointF newpos;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffed0;
  QPointF *in_stack_fffffffffffffed8;
  QRectF *in_stack_fffffffffffffee0;
  QPointF *in_stack_fffffffffffffee8;
  undefined7 in_stack_ffffffffffffff18;
  byte bVar4;
  QPointF *in_stack_ffffffffffffff28;
  QScrollerPrivate *in_stack_ffffffffffffff30;
  Orientation in_stack_ffffffffffffff48;
  State newstate;
  QPointF local_a0;
  QPointF local_90;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QPointF local_38;
  QPointF local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  deltaTime = d_func((QScroller *)0xa82635);
  if ((deltaTime->state != Pressed) && (deltaTime->state != Dragging)) {
    bVar4 = 0;
    if (deltaTime->state == Inactive) {
      QPointF::QPointF(&local_28);
      bVar1 = QScrollerPrivate::prepareScrolling
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      bVar4 = bVar1 ^ 0xff;
    }
    if ((bVar4 & 1) == 0) {
      local_38.yp = -NAN;
      local_38.xp = -NAN;
      local_38 = clampToRect(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      QPointF::x(&local_38);
      this_00 = (QScroller *)
                QScrollerPrivate::nextSnapPos(in_RDI,(qreal)in_RSI,in_EDX,in_stack_ffffffffffffff48)
      ;
      QPointF::y(&local_38);
      ypos = QScrollerPrivate::nextSnapPos(in_RDI,(qreal)in_RSI,in_EDX,in_stack_ffffffffffffff48);
      uVar2 = qIsNaN((double)this_00);
      if ((uVar2 & 1) == 0) {
        QPointF::setX(&local_38,(qreal)this_00);
      }
      uVar2 = qIsNaN(ypos);
      if ((uVar2 & 1) == 0) {
        QPointF::setY(&local_38,ypos);
      }
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcScroller();
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffed0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa827e9);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)0xa82802);
        QMessageLogger::debug();
        pQVar3 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffee8,
                                    (char *)CONCAT17(bVar4,in_stack_ffffffffffffff18));
        QDebug::QDebug(&local_58,pQVar3);
        ::operator<<((QDebug *)&local_50,(QPointF *)&local_58);
        pQVar3 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffee8,
                                    (char *)CONCAT17(bVar4,in_stack_ffffffffffffff18));
        QDebug::QDebug(&local_48,pQVar3);
        ::operator<<((QDebug *)&local_40,(QPointF *)&local_48);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffee8,
                           (char *)CONCAT17(bVar4,in_stack_ffffffffffffff18));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffee8,
                           (char *)CONCAT17(bVar4,in_stack_ffffffffffffff18));
        QDebug::~QDebug(&local_40);
        QDebug::~QDebug(&local_48);
        QDebug::~QDebug(&local_50);
        QDebug::~QDebug(&local_58);
        QDebug::~QDebug(&local_60);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      local_90 = ::operator+(in_stack_fffffffffffffed8,(QPointF *)in_stack_fffffffffffffed0);
      bVar1 = ::operator==((QPointF *)in_stack_fffffffffffffed0,
                           (QPointF *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      if (!bVar1) {
        local_a0.yp = -NAN;
        local_a0.xp = -NAN;
        local_a0 = velocity(this_00);
        if (in_EDX < 0) {
          in_EDX = 0;
        }
        this_01 = (QScrollerPrivate *)((double)in_EDX / 1000.0);
        this_02 = (QScrollerPrivate *)QPointF::x(&local_a0);
        QPointF::x(&local_38);
        QScrollerPrivate::createScrollToSegments
                  (in_RSI,(qreal)CONCAT44(in_EDX,in_stack_ffffffffffffff48),(qreal)deltaTime,
                   (qreal)this_00,(Orientation)((ulong)ypos >> 0x20),SUB84(ypos,0));
        QPointF::y(&local_a0);
        QPointF::y(&local_38);
        QScrollerPrivate::createScrollToSegments
                  (in_RSI,(qreal)CONCAT44(in_EDX,in_stack_ffffffffffffff48),(qreal)deltaTime,
                   (qreal)this_00,(Orientation)((ulong)ypos >> 0x20),SUB84(ypos,0));
        newstate = (State)((ulong)in_RSI >> 0x20);
        if (in_EDX == 0) {
          QScrollerPrivate::setContentPositionHelperScrolling(this_01);
        }
        QScrollerPrivate::setState(this_02,newstate);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScroller::scrollTo(const QPointF &pos, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    // no need to resend a prepare event if we are already scrolling
    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    QPointF newpos = clampToRect(pos, d->contentPosRange);
    qreal snapX = d->nextSnapPos(newpos.x(), 0, Qt::Horizontal);
    qreal snapY = d->nextSnapPos(newpos.y(), 0, Qt::Vertical);
    if (!qIsNaN(snapX))
        newpos.setX(snapX);
    if (!qIsNaN(snapY))
        newpos.setY(snapY);

    qCDebug(lcScroller) << "QScroller::scrollTo(req:" << pos << " [pix] / snap:"
                        << newpos << ", " << scrollTime << " [ms])";

    if (newpos == d->contentPosition + d->overshootPosition)
        return;

    QPointF vel = velocity();

    if (scrollTime < 0)
        scrollTime = 0;
    qreal time = qreal(scrollTime) / 1000;

    d->createScrollToSegments(vel.x(), time, newpos.x(), Qt::Horizontal, QScrollerPrivate::ScrollTypeScrollTo);
    d->createScrollToSegments(vel.y(), time, newpos.y(), Qt::Vertical, QScrollerPrivate::ScrollTypeScrollTo);

    if (!scrollTime)
        d->setContentPositionHelperScrolling();
    d->setState(scrollTime ? Scrolling : Inactive);
}